

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertTrue
          (UtestShell *this,bool condition,char *checkString,char *conditionString,char *text,
          char *fileName,size_t lineNumber,TestTerminator *testTerminator)

{
  char *fileName_00;
  TestResult *pTVar1;
  SimpleString local_e0 [2];
  SimpleString local_c0;
  SimpleString local_b0;
  CheckFailure local_a0;
  char *local_38;
  char *fileName_local;
  char *text_local;
  char *conditionString_local;
  char *checkString_local;
  UtestShell *pUStack_10;
  bool condition_local;
  UtestShell *this_local;
  
  local_38 = fileName;
  fileName_local = text;
  text_local = conditionString;
  conditionString_local = checkString;
  checkString_local._7_1_ = condition;
  pUStack_10 = this;
  pTVar1 = getTestResult(this);
  (*pTVar1->_vptr_TestResult[10])();
  fileName_00 = local_38;
  if ((checkString_local._7_1_ & 1) == 0) {
    SimpleString::SimpleString(&local_b0,conditionString_local);
    SimpleString::SimpleString(&local_c0,text_local);
    SimpleString::SimpleString(local_e0,fileName_local);
    CheckFailure::CheckFailure(&local_a0,this,fileName_00,lineNumber,&local_b0,&local_c0,local_e0);
    (*this->_vptr_UtestShell[0x27])(this,&local_a0,testTerminator);
    CheckFailure::~CheckFailure(&local_a0);
    SimpleString::~SimpleString(local_e0);
    SimpleString::~SimpleString(&local_c0);
    SimpleString::~SimpleString(&local_b0);
  }
  return;
}

Assistant:

void UtestShell::assertTrue(bool condition, const char *checkString, const char *conditionString, const char* text, const char *fileName, size_t lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (!condition)
        failWith(CheckFailure(this, fileName, lineNumber, checkString, conditionString, text), testTerminator);
}